

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_map(_glist *x,t_floatarg f)

{
  ushort uVar1;
  _widgetbehavior *p_Var2;
  t_selectfn p_Var3;
  int iVar4;
  _glist *p_Var5;
  _outconnect *p_Var6;
  undefined4 extraout_var;
  t_symbol *ptVar7;
  ulong uVar8;
  ulong uVar9;
  t_gobj *x_00;
  t_selection *ptVar10;
  ulong uVar11;
  char *local_148;
  char *local_140;
  t_linetraverser t;
  char tag [128];
  
  uVar1 = *(ushort *)&x->field_0xe8;
  p_Var5 = (_glist *)(ulong)uVar1;
  if ((f != 0.0) || (NAN(f))) {
    if ((uVar1 & 8) == 0) {
      p_Var5 = glist_getcanvas(p_Var5);
      if ((p_Var5->field_0xe8 & 2) != 0) {
        return;
      }
      p_Var5 = (_glist *)(ulong)*(ushort *)&x->field_0xe8;
    }
    if (((ulong)p_Var5 & 1) == 0) {
      bug("canvas_map");
      canvas_vis(x,1.0);
    }
    for (x_00 = x->gl_list; x_00 != (t_gobj *)0x0; x_00 = x_00->g_next) {
      gobj_vis(x_00,x,1);
    }
    x->field_0xe8 = x->field_0xe8 | 2;
    for (ptVar10 = x->gl_editor->e_selection; ptVar10 != (t_selection *)0x0;
        ptVar10 = ptVar10->sel_next) {
      if ((x->field_0xe8 & 2) != 0) {
        p_Var2 = ptVar10->sel_what->g_pd->c_wb;
        if ((p_Var2 != (_widgetbehavior *)0x0) &&
           (p_Var3 = p_Var2->w_selectfn, p_Var3 != (t_selectfn)0x0)) {
          (*p_Var3)(ptVar10->sel_what,x,1);
        }
      }
    }
    local_148 = tag;
    local_140 = "cord";
    t.tr_ob = (t_object *)0x0;
    t.tr_nextoc = (_outconnect *)0x0;
    t.tr_nout = 0;
    t.tr_nextoutno = 0;
    t.tr_x = x;
    while (p_Var6 = linetraverser_next(&t), p_Var6 != (_outconnect *)0x0) {
      iVar4 = sprintf(tag,"l%lx",p_Var6);
      p_Var5 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar4));
      iVar4 = t.tr_lx1;
      uVar9 = (ulong)(uint)t.tr_ly1;
      uVar8 = (ulong)(uint)t.tr_lx2;
      uVar11 = (ulong)(uint)t.tr_ly2;
      ptVar7 = outlet_getsymbol(t.tr_outlet);
      pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var5,"create","line",(ulong)(uint)iVar4,uVar9,uVar8
                  ,uVar11,"-width",(ulong)(uint)(x->gl_zoom << (ptVar7 == &s_signal)),"-tags",2,
                  &local_148);
    }
    if ((~*(uint *)&x->field_0xe8 & 0x180) == 0) {
      canvas_drawredrect(x,1);
    }
    pdgui_vmess("pdtk_canvas_getscroll","c",x);
  }
  else if (((uVar1 & 8) == 0) && (p_Var5 = glist_getcanvas(p_Var5), (p_Var5->field_0xe8 & 2) != 0))
  {
    if ((x->field_0xe8 & 1) == 0) {
      bug("canvas_map");
      return;
    }
    pdgui_vmess((char *)0x0,"crs",x,"delete","all");
    x->field_0xe8 = x->field_0xe8 & 0xfd;
  }
  return;
}

Assistant:

void canvas_map(t_canvas *x, t_floatarg f)
{
    int flag = (f != 0);
    t_gobj *y;
    if (flag)
    {
        if (!glist_isvisible(x))
        {
            t_selection *sel;
            if (!x->gl_havewindow)
            {
                bug("canvas_map");
                canvas_vis(x, 1);
            }
            for (y = x->gl_list; y; y = y->g_next)
                gobj_vis(y, x, 1);
            x->gl_mapped = 1;
            for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
                gobj_select(sel->sel_what, x, 1);
            canvas_drawlines(x);
            if (x->gl_isgraph && x->gl_goprect)
                canvas_drawredrect(x, 1);
            pdgui_vmess("pdtk_canvas_getscroll", "c", x);
        }
    }
    else
    {
        if (glist_isvisible(x))
        {
            if (!x->gl_havewindow)
            {
                bug("canvas_map");
                return;
            }
                /* just clear out the whole canvas */
            pdgui_vmess(0, "crs", x, "delete", "all");
            x->gl_mapped = 0;
        }
    }
}